

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

int __thiscall
Json::ValueIteratorBase::copy(ValueIteratorBase *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  SelfType *other_local;
  ValueIteratorBase *this_local;
  
  (this->current_)._M_node = *(_Base_ptr *)dst;
  this->isNull_ = (bool)((byte)dst[8] & 1);
  return (int)this;
}

Assistant:

void ValueIteratorBase::copy(const SelfType& other) {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  current_ = other.current_;
  isNull_ = other.isNull_;
#else
  if (isArray_)
    iterator_.array_ = other.iterator_.array_;
  iterator_.map_ = other.iterator_.map_;
#endif
}